

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vscanf.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  FILE *pFVar4;
  size_t sVar5;
  int i;
  int n;
  uint u;
  int *local_a0;
  char buffer [100];
  
  pFVar3 = freopen("test_support/testfile","wb+",_stdin);
  if (pFVar3 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/vscanf.c, line %d - %s\n"
           ,0x26,"( source = freopen( testfile, \"wb+\", stdin ) ) != NULL");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar3);
  fwrite("foo",1,3,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%3c",buffer);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0xb,1,(ulong)uVar1);
  }
  iVar2 = bcmp(buffer,"foo",3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0xc,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("%x",1,2,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%%%c%n",buffer,&n);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0xf,1,(ulong)uVar1);
  }
  if (n != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x10,"n == 2");
  }
  if (buffer[0] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x11,"buffer[0] == \'x\'");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("abcdefg",1,7,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%*[cba]%n",&n);
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x13,0,(ulong)uVar1);
  }
  if (n != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x14,"n == 3");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("foo",1,3,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%*s%n",&n);
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x15,0,(ulong)uVar1);
  }
  if (n != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x16,"n == 3");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("abc",1,3,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%*c%n",&n);
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x17,0,(ulong)uVar1);
  }
  if (n != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x18,"n == 1");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("3xfoo",1,5,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%*dx%3c",buffer);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x19,1,(ulong)uVar1);
  }
  iVar2 = bcmp(buffer,"foo",3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x1a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("-2147483648",1,0xb,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%d",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x1d,1,(ulong)uVar1);
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
         ,0x1e,"i == INT_MIN");
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("2147483647",1,10,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%d",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x1f,1,(ulong)uVar1);
  }
  if (i != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x20,"i == INT_MAX");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("-1",1,2,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%d",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x21,1,(ulong)uVar1);
  }
  if (i != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x22,"i == -1");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fputc(0x30,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%d",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x23,1,(ulong)uVar1);
  }
  if (i != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x24,"i == 0");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fputc(0x31,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%d",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x25,1,(ulong)uVar1);
  }
  if (i != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x26,"i == 1");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("-2147483648",1,0xb,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%i",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x27,1,(ulong)uVar1);
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
         ,0x28,"i == INT_MIN");
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("2147483647",1,10,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%i",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x29,1,(ulong)uVar1);
  }
  if (i != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2a,"i == INT_MAX");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("-1",1,2,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%i",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x2b,1,(ulong)uVar1);
  }
  if (i != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2c,"i == -1");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fputc(0x30,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%i",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x2d,1,(ulong)uVar1);
  }
  if (i != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2e,"i == 0");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fputc(0x31,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%i",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x2f,1,(ulong)uVar1);
  }
  if (i != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x30,"i == 1");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("0x7FFFFFFF",1,10,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%i",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x31,1,(ulong)uVar1);
  }
  if (i != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x32,"i == INT_MAX");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("0x0",1,3,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%i",&i);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x33,1,(ulong)uVar1);
  }
  if (i != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x34,"i == 0");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("00",1,2,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%i%n",&i,&n);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x36,1,(ulong)uVar1);
  }
  if (i != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x37,"i == 0");
  }
  if (n != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x38,"n == 2");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("4294967295",1,10,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%u",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x3b,1,(ulong)uVar1);
  }
  if (u != 0xffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3c,"u == UINT_MAX");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fputc(0x30,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%u",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x3d,1,(ulong)uVar1);
  }
  if (u != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3e,"u == 0");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("fFFFFFFF",1,8,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%x",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x3f,1,(ulong)uVar1);
  }
  if (u != 0xffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x40,"u == UINT_MAX");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("7FFFFFFF",1,8,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%x",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x41,1,(ulong)uVar1);
  }
  if (u != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x42,"u == INT_MAX");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fputc(0x30,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%o",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x43,1,(ulong)uVar1);
  }
  if (u != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x44,"u == 0");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("37777777777",1,0xb,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%o",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x45,1,(ulong)uVar1);
  }
  if (u != 0xffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x46,"u == UINT_MAX");
  }
  buffer[0x50] = '\0';
  buffer[0x51] = '\0';
  buffer[0x52] = '\0';
  buffer[0x53] = '\0';
  buffer[0x54] = '\0';
  buffer[0x55] = '\0';
  buffer[0x56] = '\0';
  buffer[0x57] = '\0';
  buffer[0x58] = '\0';
  buffer[0x59] = '\0';
  buffer[0x5a] = '\0';
  buffer[0x5b] = '\0';
  buffer[0x5c] = '\0';
  buffer[0x5d] = '\0';
  buffer[0x5e] = '\0';
  buffer[0x5f] = '\0';
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x60] = '\0';
  buffer[0x61] = '\0';
  buffer[0x62] = '\0';
  buffer[99] = '\0';
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fputc(0x78,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%c",buffer);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x49,1,(ulong)uVar1);
  }
  if (buffer._0_2_ != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4a,"memcmp( buffer, \"x\\0\", 2 ) == 0");
  }
  buffer[0x50] = '\0';
  buffer[0x51] = '\0';
  buffer[0x52] = '\0';
  buffer[0x53] = '\0';
  buffer[0x54] = '\0';
  buffer[0x55] = '\0';
  buffer[0x56] = '\0';
  buffer[0x57] = '\0';
  buffer[0x58] = '\0';
  buffer[0x59] = '\0';
  buffer[0x5a] = '\0';
  buffer[0x5b] = '\0';
  buffer[0x5c] = '\0';
  buffer[0x5d] = '\0';
  buffer[0x5e] = '\0';
  buffer[0x5f] = '\0';
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x60] = '\0';
  buffer[0x61] = '\0';
  buffer[0x62] = '\0';
  buffer[99] = '\0';
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("foo bar",1,7,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%s%n",buffer,&n);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x4e,1,(ulong)uVar1);
  }
  if (buffer._0_4_ != 0x6f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4f,"memcmp( buffer, \"foo\\0\", 4 ) == 0");
  }
  if (n != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x50,"n == 3");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("foo bar  baz",1,0xc,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%s %s %n",buffer,buffer + 4,&n);
  if (uVar1 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x51,2,(ulong)uVar1);
  }
  if (n != 9) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x52,"n == 9");
  }
  if (buffer._0_8_ != 0x726162006f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x53,"memcmp( buffer, \"foo\\0bar\\0\", 8 ) == 0");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("abcdefg",1,7,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%[cba]",buffer);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x56,1,(ulong)uVar1);
  }
  if (buffer._0_4_ != 0x636261) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x57,"memcmp( buffer, \"abc\\0\", 4 ) == 0");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%[cba]",buffer);
  if (uVar1 != 0xffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x59,0xffffffffffffffff,(ulong)uVar1);
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fputc(0x33,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%u%[cba]",&u,buffer);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x5a,1,(ulong)uVar1);
  }
  sprintf(buffer,"%p",0);
  local_a0 = &i;
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  sVar5 = strlen(buffer);
  fwrite(buffer,1,sVar5,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%p",&local_a0);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x60,1,(ulong)uVar1);
  }
  if (local_a0 != (int *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x61,"p == NULL");
  }
  local_a0 = &i;
  sprintf(buffer,"%p",&i);
  local_a0 = (int *)0x0;
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  sVar5 = strlen(buffer);
  fwrite(buffer,1,sVar5,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%p",&local_a0);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x65,1,(ulong)uVar1);
  }
  if (local_a0 != &i) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x66,"p == &i");
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%d",&i);
  if (uVar1 != 0xffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x68,0xffffffffffffffff,(ulong)uVar1);
  }
  pFVar4 = freopen("test_support/testfile","wb+",pFVar4);
  fwrite("foo",1,3,pFVar4);
  pFVar3 = pFVar4;
  rewind(pFVar4);
  uVar1 = testscanf((FILE *)pFVar3,"%5c",buffer);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf(_stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/vscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x69,1,(ulong)uVar1);
  }
  iVar2 = bcmp(buffer,"foo",3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x6a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  iVar2 = fclose(pFVar4);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/vscanf.c, line %d - %s\n"
           ,0x28,"fclose( source ) == 0");
  }
  iVar2 = remove("test_support/testfile");
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/vscanf.c, line %d - %s\n"
           ,0x29,"remove( testfile ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * source;
    TESTCASE( ( source = freopen( testfile, "wb+", stdin ) ) != NULL );
#include "scanf_testcases.h"
    TESTCASE( fclose( source ) == 0 );
    TESTCASE( remove( testfile ) == 0 );
    return TEST_RESULTS;
}